

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int tabIsReadOnly(Parse *pParse,Table *pTab)

{
  sqlite3 *db_00;
  int iVar1;
  VTable *pVVar2;
  bool local_2a;
  bool local_29;
  sqlite3 *db;
  Table *pTab_local;
  Parse *pParse_local;
  
  if (pTab->nModuleArg == 0) {
    if ((pTab->tabFlags & 0x401) == 0) {
      pParse_local._4_4_ = 0;
    }
    else {
      db_00 = pParse->db;
      if ((pTab->tabFlags & 1) == 0) {
        local_2a = false;
        if (((db_00->flags & 0x10000000) != 0) &&
           (local_2a = false, db_00->pVtabCtx == (VtabCtx *)0x0)) {
          local_2a = db_00->nVdbeExec == 0;
        }
        pParse_local._4_4_ = (uint)local_2a;
      }
      else {
        iVar1 = sqlite3WritableSchema(db_00);
        local_29 = false;
        if (iVar1 == 0) {
          local_29 = pParse->nested == '\0';
        }
        pParse_local._4_4_ = (uint)local_29;
      }
    }
  }
  else {
    pVVar2 = sqlite3GetVTable(pParse->db,pTab);
    pParse_local._4_4_ =
         (uint)(pVVar2->pMod->pModule->xUpdate ==
               (_func_int_sqlite3_vtab_ptr_int_sqlite3_value_ptr_ptr_sqlite3_int64_ptr *)0x0);
  }
  return pParse_local._4_4_;
}

Assistant:

static int tabIsReadOnly(Parse *pParse, Table *pTab){
  sqlite3 *db;
  if( IsVirtual(pTab) ){
    return sqlite3GetVTable(pParse->db, pTab)->pMod->pModule->xUpdate==0;
  }
  if( (pTab->tabFlags & (TF_Readonly|TF_Shadow))==0 ) return 0;
  db = pParse->db;
  if( (pTab->tabFlags & TF_Readonly)!=0 ){
    return sqlite3WritableSchema(db)==0 && pParse->nested==0;
  }
  assert( pTab->tabFlags & TF_Shadow );
  return (db->flags & SQLITE_Defensive)!=0 
#ifndef SQLITE_OMIT_VIRTUALTABLE
          && db->pVtabCtx==0
#endif
          && db->nVdbeExec==0;
}